

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O1

int Cmd_RunAutoTunerEval(Vec_Ptr_t *vAigs,satoko_opts_t *pOpts,int nProcs)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *__ptr;
  void *__dest;
  ulong uVar4;
  long lVar5;
  pthread_t *__newthread;
  ulong uVar6;
  int iVar7;
  long *__arg;
  Cmd_AutoData_t ThData [100];
  pthread_t WorkerThread [100];
  long local_fd8 [2];
  undefined4 local_fc8;
  undefined8 local_fc4;
  int local_fbc [793];
  pthread_t local_358 [101];
  
  if (nProcs == 1) {
    iVar3 = Cmd_RunAutoTunerEvalSimple(vAigs,pOpts);
    return iVar3;
  }
  if (99 < nProcs - 2U) {
    __assert_fail("nProcs >= 1 && nProcs <= CMD_THR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                  ,0xa1,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
  }
  uVar6 = (ulong)(nProcs - 1);
  if (1 < nProcs) {
    __arg = local_fd8;
    __newthread = local_358;
    uVar4 = 0;
    do {
      *__arg = 0;
      __arg[1] = (long)pOpts;
      *(int *)(__arg + 2) = (int)uVar4;
      *(undefined8 *)((long)__arg + 0x14) = 0xffffffff;
      *(undefined4 *)((long)__arg + 0x1c) = 0xffffffff;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,Cmd_RunAutoTunerEvalWorkerThread,
                             __arg);
      if (iVar3 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0xab,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
      }
      uVar4 = uVar4 + 1;
      __arg = __arg + 4;
      __newthread = __newthread + 1;
    } while (uVar6 != uVar4);
  }
  __ptr = (int *)malloc(0x10);
  iVar3 = vAigs->nSize;
  __ptr[1] = iVar3;
  iVar1 = vAigs->nCap;
  iVar7 = 0;
  *__ptr = iVar1;
  if ((long)iVar1 == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc((long)iVar1 << 3);
  }
  *(void **)(__ptr + 2) = __dest;
  memcpy(__dest,vAigs->pArray,(long)iVar3 << 3);
  uVar4 = (ulong)(uint)__ptr[1];
  do {
    bVar2 = 0 < (int)uVar4;
    if (1 < nProcs) {
      lVar5 = 0;
      do {
        if (*(int *)((long)local_fbc + lVar5 + -4) == 0) {
          iVar3 = (int)uVar4;
          if (*(long *)((long)local_fd8 + lVar5) != 0) {
            if (*(int *)((long)local_fbc + lVar5) < 0) {
              __ptr[1] = iVar3;
              __assert_fail("ThData[i].Result >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                            ,0xbd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
            }
            iVar7 = iVar7 + *(int *)((long)local_fbc + lVar5);
            *(undefined8 *)((long)local_fd8 + lVar5) = 0;
          }
          if (iVar3 != 0) {
            if (*(long *)((long)local_fd8 + lVar5) != 0) {
              __ptr[1] = iVar3;
              __assert_fail("ThData[i].pGia == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                            ,0xc4,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
            }
            if (iVar3 < 1) {
              __ptr[1] = iVar3;
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
            }
            uVar4 = (ulong)(iVar3 - 1);
            *(undefined8 *)((long)local_fd8 + lVar5) = *(undefined8 *)((long)__dest + uVar4 * 8);
            *(undefined4 *)((long)local_fbc + lVar5 + -4) = 1;
          }
        }
        else {
          bVar2 = true;
        }
        lVar5 = lVar5 + 0x20;
      } while (uVar6 << 5 != lVar5);
    }
    if (!bVar2) {
      __ptr[1] = (int)uVar4;
      if (__dest != (void *)0x0) {
        free(__dest);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      if (1 < nProcs) {
        lVar5 = 0;
        do {
          if (*(int *)((long)local_fbc + lVar5 + -4) != 0) {
            __assert_fail("!ThData[i].fWorking",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                          ,0xcd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
          }
          *(undefined8 *)((long)local_fd8 + lVar5) = 0;
          *(undefined4 *)((long)local_fbc + lVar5 + -4) = 1;
          lVar5 = lVar5 + 0x20;
        } while (uVar6 << 5 != lVar5);
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

int Cmd_RunAutoTunerEval( Vec_Ptr_t * vAigs, satoko_opts_t * pOpts, int nProcs )
{
    Cmd_AutoData_t ThData[CMD_THR_MAX];
    pthread_t WorkerThread[CMD_THR_MAX];
    int i, status, fWorkToDo = 1, TotalCost = 0;
    Vec_Ptr_t * vStack;
    if ( nProcs == 1 )
        return Cmd_RunAutoTunerEvalSimple( vAigs, pOpts );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= CMD_THR_MAX );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].pGia     = NULL;
        ThData[i].pOpts    = pOpts;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = -1;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cmd_RunAutoTunerEvalWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    vStack = Vec_PtrDup(vAigs);
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].pGia != NULL )
            {
                assert( ThData[i].Result >= 0 );
                TotalCost += ThData[i].Result;
                ThData[i].pGia = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // give this thread a new job
            assert( ThData[i].pGia == NULL );
            ThData[i].pGia = (Gia_Man_t *)Vec_PtrPop( vStack );
            ThData[i].fWorking = 1;
        }
    }
    Vec_PtrFree( vStack );
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // stop
        ThData[i].pGia = NULL;
        ThData[i].fWorking = 1;
    }
    return TotalCost;
}